

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_extension.cpp
# Opt level: O1

void duckdb::GetEnvFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  undefined1 *puVar2;
  anon_union_16_2_67f50693_for_value *paVar3;
  anon_union_16_2_67f50693_for_value *paVar4;
  unsigned_long *puVar5;
  sel_t *psVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  reference vector;
  element_type *peVar10;
  TemplatedValidityData<unsigned_long> *pTVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> idx;
  unsigned_long uVar12;
  ulong uVar13;
  long lVar14;
  element_type *peVar15;
  data_ptr_t pdVar16;
  void *in_R8;
  idx_t idx_in_entry;
  element_type *peVar17;
  element_type *peVar18;
  ulong uVar19;
  string_t input;
  string_t input_00;
  string_t input_01;
  string_t input_02;
  string_t sVar20;
  anon_struct_16_3_d7536bce_for_pointer aVar21;
  ValidityMask local_c8;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  reference local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  peVar17 = (element_type *)args->count;
  local_c8.super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)result;
  local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar17;
  if (vector->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)result->data;
    pdVar16 = vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar5 == (unsigned_long *)0x0) {
      if (peVar17 != (element_type *)0x0) {
        lVar14 = 8;
        do {
          sVar20.value.pointer.ptr = (char *)*(undefined8 *)(pdVar16 + lVar14);
          sVar20.value._0_8_ = *(undefined8 *)(pdVar16 + lVar14 + -8);
          sVar20 = UnaryLambdaWrapper::
                   Operation<duckdb::GetEnvFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t>
                             (sVar20,&local_c8,(idx_t)in_RCX._M_pi,in_R8);
          *(long *)((long)local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                          .
                          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi + lVar14 + -8) = sVar20.value._0_8_;
          *(long *)((long)&(local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.
                            internal.
                            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_vptr__Sp_counted_base + lVar14) =
               sVar20.value._8_8_;
          lVar14 = lVar14 + 0x10;
          peVar17 = (element_type *)
                    ((long)&peVar17[-1].owned_data.
                            super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                            ._M_t.
                            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                            .super__Head_base<0UL,_unsigned_long_*,_false> + 7);
          in_RCX._M_pi = local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
        } while (peVar17 != (element_type *)0x0);
      }
    }
    else {
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar5;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      puVar2 = (undefined1 *)
               ((long)&peVar17[7].owned_data.
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false> + 7);
      if ((undefined1 *)0x3f < puVar2) {
        local_c8.super_TemplatedValidityMask<unsigned_long>.capacity = (ulong)puVar2 >> 6;
        idx._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        peVar10 = (element_type *)0x0;
        local_90 = vector;
        do {
          _Var8._M_pi = local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          puVar5 = (local_90->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            uVar12 = 0xffffffffffffffff;
          }
          else {
            uVar12 = puVar5[(long)idx._M_pi];
          }
          peVar18 = peVar10 + 8;
          if (peVar17 <= peVar10 + 8) {
            peVar18 = peVar17;
          }
          peVar15 = peVar18;
          local_88 = idx._M_pi;
          if (uVar12 != 0) {
            peVar15 = peVar10;
            if (uVar12 == 0xffffffffffffffff) {
              if (peVar10 < peVar18) {
                uVar13 = (long)peVar10 << 4 | 8;
                do {
                  input.value.pointer.ptr = (char *)*(undefined8 *)(pdVar16 + uVar13);
                  input.value._0_8_ = *(undefined8 *)(pdVar16 + (uVar13 - 8));
                  sVar20 = UnaryLambdaWrapper::
                           Operation<duckdb::GetEnvFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t>
                                     (input,&local_c8,(idx_t)idx._M_pi,in_R8);
                  *(long *)((long)_Var8._M_pi + (uVar13 - 8)) = sVar20.value._0_8_;
                  *(long *)((long)&(_Var8._M_pi)->_vptr__Sp_counted_base + uVar13) =
                       sVar20.value._8_8_;
                  peVar15 = (element_type *)
                            ((long)&(peVar15->owned_data).
                                    super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                    ._M_t.
                                    super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                    .super__Head_base<0UL,_unsigned_long_*,_false> + 1);
                  uVar13 = uVar13 + 0x10;
                } while (peVar18 != peVar15);
              }
            }
            else if (peVar10 < peVar18) {
              uVar19 = (long)peVar10 << 4 | 8;
              uVar13 = 0;
              do {
                if ((uVar12 >> (uVar13 & 0x3f) & 1) != 0) {
                  input_00.value.pointer.ptr = (char *)*(undefined8 *)(pdVar16 + uVar19);
                  input_00.value._0_8_ = *(undefined8 *)(pdVar16 + (uVar19 - 8));
                  sVar20 = UnaryLambdaWrapper::
                           Operation<duckdb::GetEnvFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t>
                                     (input_00,&local_c8,(idx_t)idx._M_pi,in_R8);
                  *(long *)((long)local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.
                                  internal.
                                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi + (uVar19 - 8)) = sVar20.value._0_8_;
                  *(long *)((long)&(local_c8.super_TemplatedValidityMask<unsigned_long>.
                                    validity_data.internal.
                                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + uVar19) =
                       sVar20.value._8_8_;
                  idx._M_pi = local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.
                              internal.
                              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi;
                }
                uVar13 = uVar13 + 1;
                uVar19 = uVar19 + 0x10;
              } while ((long)peVar10 + (uVar13 - (long)peVar18) != 0);
              peVar15 = (element_type *)
                        ((long)&(peVar10->owned_data).
                                super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                ._M_t.
                                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                .super__Head_base<0UL,_unsigned_long_*,_false> + uVar13);
              peVar17 = local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
            }
          }
          idx._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&local_88->_vptr__Sp_counted_base + 1);
          peVar10 = peVar15;
        } while (idx._M_pi !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_c8.super_TemplatedValidityMask<unsigned_long>.capacity);
      }
    }
  }
  else if (vector->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    paVar3 = (anon_union_16_2_67f50693_for_value *)result->data;
    paVar4 = (anon_union_16_2_67f50693_for_value *)vector->data;
    puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
      ConstantVector::SetNull(result,true);
      return;
    }
    ConstantVector::SetNull(result,false);
    aVar21 = (anon_struct_16_3_d7536bce_for_pointer)
             UnaryLambdaWrapper::
             Operation<duckdb::GetEnvFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t>
                       ((string_t)paVar4->pointer,&local_c8,(idx_t)in_RCX._M_pi,in_R8);
    paVar3->pointer = aVar21;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(vector,(idx_t)peVar17,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar16 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (element_type *)0x0) {
        psVar6 = (local_78.sel)->sel_vector;
        pdVar16 = pdVar16 + 8;
        peVar17 = (element_type *)0x0;
        do {
          peVar10 = peVar17;
          if (psVar6 != (sel_t *)0x0) {
            peVar10 = (element_type *)(ulong)psVar6[(long)peVar17];
          }
          input_02.value.pointer.ptr =
               (char *)*(undefined8 *)(local_78.data + (long)peVar10 * 0x10 + 8);
          input_02.value._0_8_ = *(undefined8 *)(local_78.data + (long)peVar10 * 0x10);
          sVar20 = UnaryLambdaWrapper::
                   Operation<duckdb::GetEnvFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t>
                             (input_02,&local_c8,(idx_t)in_RCX._M_pi,in_R8);
          *(long *)(pdVar16 + -8) = sVar20.value._0_8_;
          *(long *)pdVar16 = sVar20.value._8_8_;
          peVar17 = (element_type *)
                    ((long)&(peVar17->owned_data).
                            super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                            ._M_t.
                            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                            .super__Head_base<0UL,_unsigned_long_*,_false> + 1);
          pdVar16 = pdVar16 + 0x10;
        } while (local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr != peVar17);
      }
    }
    else if (local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr != (element_type *)0x0) {
      psVar6 = (local_78.sel)->sel_vector;
      pdVar16 = pdVar16 + 8;
      peVar17 = (element_type *)0x0;
      do {
        peVar10 = peVar17;
        if (psVar6 != (sel_t *)0x0) {
          peVar10 = (element_type *)(ulong)psVar6[(long)peVar17];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [(ulong)peVar10 >> 6] >> ((ulong)peVar10 & 0x3f) & 1) == 0) {
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_a8,&local_80);
            p_Var9 = p_Stack_a0;
            peVar10 = local_a8;
            local_a8 = (element_type *)0x0;
            p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar10;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var9;
            if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            }
            if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
            }
            pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (unsigned_long *)
                 (pTVar11->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
          }
          bVar7 = (byte)peVar17 & 0x3f;
          puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                   ((ulong)peVar17 >> 6);
          *puVar1 = *puVar1 & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
        }
        else {
          input_01.value.pointer.ptr =
               (char *)*(undefined8 *)(local_78.data + (long)peVar10 * 0x10 + 8);
          input_01.value._0_8_ = *(undefined8 *)(local_78.data + (long)peVar10 * 0x10);
          sVar20 = UnaryLambdaWrapper::
                   Operation<duckdb::GetEnvFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t>
                             (input_01,&local_c8,
                              local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                              validity_mask[(ulong)peVar10 >> 6],in_R8);
          *(long *)(pdVar16 + -8) = sVar20.value._0_8_;
          *(long *)pdVar16 = sVar20.value._8_8_;
        }
        peVar17 = (element_type *)
                  ((long)&(peVar17->owned_data).
                          super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                          _M_t.
                          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                          .super__Head_base<0UL,_unsigned_long_*,_false> + 1);
        pdVar16 = pdVar16 + 0x10;
      } while (local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr != peVar17);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void GetEnvFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	UnaryExecutor::Execute<string_t, string_t>(args.data[0], result, args.size(), [&](string_t input) {
		string env_name = input.GetString();
		auto env_value = getenv(env_name.c_str());
		if (!env_value) {
			return StringVector::AddString(result, string());
		}
		return StringVector::AddString(result, env_value);
	});
}